

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void clearbyvalues(global_State *g,GCObject *l,GCObject *f)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  int iVar5;
  GCObject *pGVar6;
  GCObject *local_68;
  GCObject *local_58;
  TValue *o;
  uint i;
  Node *limit;
  Node *n;
  Table *h;
  GCObject *f_local;
  GCObject *l_local;
  global_State *g_local;
  
  f_local = l;
  while( true ) {
    if (f_local == f) {
      return;
    }
    if (f_local->tt != '\x05') break;
    lVar4 = *(long *)&f_local[1].tt;
    bVar1 = f_local->field_0xb;
    for (o._4_4_ = 0; o._4_4_ < *(uint *)&f_local->field_0xc; o._4_4_ = o._4_4_ + 1) {
      pGVar6 = f_local[1].next + o._4_4_;
      uVar2._0_1_ = pGVar6->tt;
      uVar2._1_1_ = pGVar6->marked;
      if ((uVar2 & 0x8000) == 0) {
        local_58 = (GCObject *)0x0;
      }
      else {
        uVar3._0_1_ = pGVar6->tt;
        uVar3._1_1_ = pGVar6->marked;
        if ((uVar3 & 0x8000) == 0) {
          __assert_fail("(((o)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x344,"void clearbyvalues(global_State *, GCObject *, GCObject *)");
        }
        local_58 = pGVar6->next;
      }
      iVar5 = iscleared(g,local_58);
      if (iVar5 != 0) {
        pGVar6->tt = '\0';
        pGVar6->marked = '\0';
      }
    }
    for (limit = *(Node **)&f_local[1].tt;
        limit < (Node *)(lVar4 + (long)(1 << (bVar1 & 0x1f)) * 0x20); limit = limit + 1) {
      if (((limit->i_val).tt_ & 0x8000) == 0) {
        local_68 = (GCObject *)0x0;
      }
      else {
        if (((limit->i_val).tt_ & 0x8000) == 0) {
          __assert_fail("((((&(n)->i_val))->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x348,"void clearbyvalues(global_State *, GCObject *, GCObject *)");
        }
        local_68 = (limit->i_val).value_.gc;
      }
      iVar5 = iscleared(g,local_68);
      if (iVar5 != 0) {
        (limit->i_val).tt_ = 0;
      }
      if ((limit->i_val).tt_ == 0) {
        removeentry(limit);
      }
    }
    if (f_local->tt != '\x05') {
      __assert_fail("(l)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x33e,"void clearbyvalues(global_State *, GCObject *, GCObject *)");
    }
    f_local = f_local[3].next;
  }
  __assert_fail("(l)->tt == 5",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                ,0x33f,"void clearbyvalues(global_State *, GCObject *, GCObject *)");
}

Assistant:

static void clearbyvalues (global_State *g, GCObject *l, GCObject *f) {
  for (; l != f; l = gco2t(l)->gclist) {
    Table *h = gco2t(l);
    Node *n, *limit = gnodelast(h);
    unsigned int i;
    for (i = 0; i < h->sizearray; i++) {
      TValue *o = &h->array[i];
      if (iscleared(g, gcvalueN(o)))  /* value was collected? */
        setnilvalue(o);  /* remove value */
    }
    for (n = gnode(h, 0); n < limit; n++) {
      if (iscleared(g, gcvalueN(gval(n))))
        setnilvalue(gval(n));  /* remove value ... */
      if (ttisnil(gval(n))) 
        removeentry(n);  /* and remove entry from table */
    }
  }
}